

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

mFILE * mstderr(void)

{
  mFILE *pmVar1;
  
  if (m_channel_2 != (mFILE *)0x0) {
    return m_channel_2;
  }
  pmVar1 = (mFILE *)malloc(0x38);
  if (pmVar1 == (mFILE *)0x0) {
    pmVar1 = (mFILE *)0x0;
  }
  else {
    *(undefined8 *)((long)&pmVar1->data + 4) = 0;
    *(undefined8 *)((long)&pmVar1->alloced + 4) = 0;
    pmVar1->fp = (FILE *)0x0;
    pmVar1->data = (char *)0x0;
    pmVar1->size = 0;
    pmVar1->offset = 0;
    pmVar1->flush_pos = 0;
    pmVar1->mode = 3;
  }
  m_channel_2 = pmVar1;
  if (pmVar1 == (mFILE *)0x0) {
    pmVar1 = (mFILE *)0x0;
  }
  else {
    pmVar1->fp = _stderr;
    pmVar1->mode = 2;
  }
  return pmVar1;
}

Assistant:

mFILE *mstderr(void) {
    if (m_channel[2])
	return m_channel[2];

    m_channel[2] = mfcreate(NULL, 0);
    if (NULL == m_channel[2]) return NULL;
    m_channel[2]->fp = stderr;
    m_channel[2]->mode = MF_WRITE;
    return m_channel[2];
}